

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.c
# Opt level: O1

effect_index effect_lookup(char *name)

{
  int iVar1;
  ulong unaff_RBX;
  ulong uVar2;
  char **ppcVar3;
  bool bVar4;
  
  ppcVar3 = effect_names;
  uVar2 = 0;
  while( true ) {
    if (uVar2 == 0) {
      bVar4 = true;
    }
    else {
      iVar1 = strcmp(name,*ppcVar3);
      bVar4 = iVar1 != 0;
      if (!bVar4) {
        unaff_RBX = uVar2;
      }
      unaff_RBX = unaff_RBX & 0xffffffff;
    }
    if (!bVar4) break;
    uVar2 = uVar2 + 1;
    ppcVar3 = ppcVar3 + 1;
    if (uVar2 == 0x80) {
      return EF_MAX;
    }
  }
  return (effect_index)unaff_RBX;
}

Assistant:

effect_index effect_lookup(const char *name)
{
	size_t i;

	for (i = 0; i < N_ELEMENTS(effect_names); i++) {
		const char *effect_name = effect_names[i];

		/* Test for equality */
		if (effect_name != NULL && streq(name, effect_name))
			return i;
	}

	return EF_MAX;
}